

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_socket.c
# Opt level: O2

int pcp_socket_create_impl(int domain,int type,int protocol)

{
  ushort uVar1;
  int __fd;
  uint uVar2;
  int iVar3;
  pcp_errno pVar4;
  socklen_t __len;
  char *pcVar5;
  int optval;
  undefined4 local_bc;
  sockaddr_storage sas;
  
  sas.__ss_padding[6] = '\0';
  sas.__ss_padding[7] = '\0';
  sas.__ss_padding[8] = '\0';
  sas.__ss_padding[9] = '\0';
  sas.__ss_padding[10] = '\0';
  sas.__ss_padding[0xb] = '\0';
  sas.__ss_padding[0xc] = '\0';
  sas.__ss_padding[0xd] = '\0';
  sas.__ss_padding[0x6e] = '\0';
  sas.__ss_padding[0x6f] = '\0';
  sas.__ss_padding[0x70] = '\0';
  sas.__ss_padding[0x71] = '\0';
  sas.__ss_padding[0x72] = '\0';
  sas.__ss_padding[0x73] = '\0';
  sas.__ss_padding[0x74] = '\0';
  sas.__ss_padding[0x75] = '\0';
  sas.__ss_align = 0;
  sas.__ss_padding[0x5e] = '\0';
  sas.__ss_padding[0x5f] = '\0';
  sas.__ss_padding[0x60] = '\0';
  sas.__ss_padding[0x61] = '\0';
  sas.__ss_padding[0x62] = '\0';
  sas.__ss_padding[99] = '\0';
  sas.__ss_padding[100] = '\0';
  sas.__ss_padding[0x65] = '\0';
  sas.__ss_padding[0x66] = '\0';
  sas.__ss_padding[0x67] = '\0';
  sas.__ss_padding[0x68] = '\0';
  sas.__ss_padding[0x69] = '\0';
  sas.__ss_padding[0x6a] = '\0';
  sas.__ss_padding[0x6b] = '\0';
  sas.__ss_padding[0x6c] = '\0';
  sas.__ss_padding[0x6d] = '\0';
  sas.__ss_padding[0x4e] = '\0';
  sas.__ss_padding[0x4f] = '\0';
  sas.__ss_padding[0x50] = '\0';
  sas.__ss_padding[0x51] = '\0';
  sas.__ss_padding[0x52] = '\0';
  sas.__ss_padding[0x53] = '\0';
  sas.__ss_padding[0x54] = '\0';
  sas.__ss_padding[0x55] = '\0';
  sas.__ss_padding[0x56] = '\0';
  sas.__ss_padding[0x57] = '\0';
  sas.__ss_padding[0x58] = '\0';
  sas.__ss_padding[0x59] = '\0';
  sas.__ss_padding[0x5a] = '\0';
  sas.__ss_padding[0x5b] = '\0';
  sas.__ss_padding[0x5c] = '\0';
  sas.__ss_padding[0x5d] = '\0';
  sas.__ss_padding[0x3e] = '\0';
  sas.__ss_padding[0x3f] = '\0';
  sas.__ss_padding[0x40] = '\0';
  sas.__ss_padding[0x41] = '\0';
  sas.__ss_padding[0x42] = '\0';
  sas.__ss_padding[0x43] = '\0';
  sas.__ss_padding[0x44] = '\0';
  sas.__ss_padding[0x45] = '\0';
  sas.__ss_padding[0x46] = '\0';
  sas.__ss_padding[0x47] = '\0';
  sas.__ss_padding[0x48] = '\0';
  sas.__ss_padding[0x49] = '\0';
  sas.__ss_padding[0x4a] = '\0';
  sas.__ss_padding[0x4b] = '\0';
  sas.__ss_padding[0x4c] = '\0';
  sas.__ss_padding[0x4d] = '\0';
  sas.__ss_padding[0x2e] = '\0';
  sas.__ss_padding[0x2f] = '\0';
  sas.__ss_padding[0x30] = '\0';
  sas.__ss_padding[0x31] = '\0';
  sas.__ss_padding[0x32] = '\0';
  sas.__ss_padding[0x33] = '\0';
  sas.__ss_padding[0x34] = '\0';
  sas.__ss_padding[0x35] = '\0';
  sas.__ss_padding[0x36] = '\0';
  sas.__ss_padding[0x37] = '\0';
  sas.__ss_padding[0x38] = '\0';
  sas.__ss_padding[0x39] = '\0';
  sas.__ss_padding[0x3a] = '\0';
  sas.__ss_padding[0x3b] = '\0';
  sas.__ss_padding[0x3c] = '\0';
  sas.__ss_padding[0x3d] = '\0';
  sas.__ss_padding[0x1e] = '\0';
  sas.__ss_padding[0x1f] = '\0';
  sas.__ss_padding[0x20] = '\0';
  sas.__ss_padding[0x21] = '\0';
  sas.__ss_padding[0x22] = '\0';
  sas.__ss_padding[0x23] = '\0';
  sas.__ss_padding[0x24] = '\0';
  sas.__ss_padding[0x25] = '\0';
  sas.__ss_padding[0x26] = '\0';
  sas.__ss_padding[0x27] = '\0';
  sas.__ss_padding[0x28] = '\0';
  sas.__ss_padding[0x29] = '\0';
  sas.__ss_padding[0x2a] = '\0';
  sas.__ss_padding[0x2b] = '\0';
  sas.__ss_padding[0x2c] = '\0';
  sas.__ss_padding[0x2d] = '\0';
  sas.__ss_padding[0xe] = '\0';
  sas.__ss_padding[0xf] = '\0';
  sas.__ss_padding[0x10] = '\0';
  sas.__ss_padding[0x11] = '\0';
  sas.__ss_padding[0x12] = '\0';
  sas.__ss_padding[0x13] = '\0';
  sas.__ss_padding[0x14] = '\0';
  sas.__ss_padding[0x15] = '\0';
  sas.__ss_padding[0x16] = '\0';
  sas.__ss_padding[0x17] = '\0';
  sas.__ss_padding[0x18] = '\0';
  sas.__ss_padding[0x19] = '\0';
  sas.__ss_padding[0x1a] = '\0';
  sas.__ss_padding[0x1b] = '\0';
  sas.__ss_padding[0x1c] = '\0';
  sas.__ss_padding[0x1d] = '\0';
  sas.__ss_padding[0] = '\0';
  sas.__ss_padding[1] = '\0';
  sas.__ss_padding[2] = '\0';
  sas.__ss_padding[3] = '\0';
  sas.__ss_padding[4] = '\0';
  sas.__ss_padding[5] = '\0';
  sas.ss_family = (ushort)domain;
  if ((domain == 10) || (domain == 2)) {
    sas.__ss_padding[0] = '\x14';
    sas.__ss_padding[1] = -0x1a;
    sas.__ss_padding[2] = '\0';
    sas.__ss_padding[3] = '\0';
    sas.__ss_padding[4] = '\0';
    sas.__ss_padding[5] = '\0';
  }
  else {
    pcp_logger(PCP_LOGLVL_ERR,"Unsupported socket domain:%d",(ulong)(uint)domain);
  }
  __fd = socket(domain,type,protocol);
  if (__fd != -1) {
    uVar2 = fcntl(__fd,3,0);
    iVar3 = fcntl(__fd,4,(ulong)(uVar2 | 0x800));
    if (iVar3 == 0) {
      local_bc = 0;
      iVar3 = setsockopt(__fd,0x29,0x1a,&local_bc,4);
      if (iVar3 == -1) {
        pcVar5 = 
        "Dual-stack sockets are not supported on this platform. Recompile library with disabled IPv6 support."
        ;
      }
      else {
        optval = 1;
        iVar3 = setsockopt(__fd,0,8,&optval,4);
        if (iVar3 < 0) {
          pcp_logger(PCP_LOGLVL_ERR,"%s","Unable to set IP_PKTINFO option for socket.");
        }
        iVar3 = setsockopt(__fd,0x29,0x31,&optval,4);
        if (iVar3 < 0) {
          pcVar5 = "Unable to set IPV6_RECVPKTINFO option for socket.";
        }
        else {
          while( true ) {
            __len = 0x1c;
            if ((short)domain != 10) {
              __len = 0x10;
            }
            iVar3 = bind(__fd,(sockaddr *)&sas,__len);
            if (iVar3 != -1) {
              return __fd;
            }
            pVar4 = pcp_get_error();
            if (pVar4 != PCP_ERR_ADDRINUSE) break;
            domain = (int)sas.ss_family;
            uVar1 = (sas.__ss_padding._0_2_ << 8 | (ushort)sas.__ss_padding._0_2_ >> 8) + 1;
            uVar1 = uVar1 * 0x100 | uVar1 >> 8;
            sas.__ss_padding[0] = (char)uVar1;
            sas.__ss_padding[1] = (char)(uVar1 >> 8);
          }
          pcVar5 = "bind error";
        }
      }
    }
    else {
      pcVar5 = "Unable to set nonblocking mode for socket.";
    }
    pcp_logger(PCP_LOGLVL_ERR,"%s",pcVar5);
    close(__fd);
  }
  return -1;
}

Assistant:

static PCP_SOCKET pcp_socket_create_impl(int domain, int type, int protocol) {
#ifdef PCP_SOCKET_IS_VOIDPTR
    return PCP_INVALID_SOCKET;
#else
    PCP_SOCKET s;
    uint32_t flg;
    unsigned long iMode = 1;
    struct sockaddr_storage sas;
    struct sockaddr_in *sin = (struct sockaddr_in *)&sas;
    struct sockaddr_in6 *sin6 = (struct sockaddr_in6 *)&sas;

    OSDEP(iMode);
    OSDEP(flg);

    memset(&sas, 0, sizeof(sas));
    sas.ss_family = domain;
    if (domain == AF_INET) {
        sin->sin_port = htons(5350);
        SET_SA_LEN(sin, sizeof(struct sockaddr_in));
    } else if (domain == AF_INET6) {
        sin6->sin6_port = htons(5350);
        SET_SA_LEN(sin6, sizeof(struct sockaddr_in6));
    } else {
        PCP_LOG(PCP_LOGLVL_ERR, "Unsupported socket domain:%d", domain);
    }

    s = (PCP_SOCKET)socket(domain, type, protocol);
    if (s == PCP_INVALID_SOCKET)
        return PCP_INVALID_SOCKET;

#ifdef WIN32
    if (ioctlsocket(s, FIONBIO, &iMode)) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s",
                "Unable to set nonblocking mode for socket.");
        CLOSE(s);
        return PCP_INVALID_SOCKET;
    }
#else  // WIN32
    flg = fcntl(s, F_GETFL, 0);
    if (fcntl(s, F_SETFL, flg | O_NONBLOCK)) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s",
                "Unable to set nonblocking mode for socket.");
        CLOSE(s);
        return PCP_INVALID_SOCKET;
    }
#endif //! WIN32
#ifdef PCP_USE_IPV6_SOCKET
    flg = 0;
    if (PCP_SOCKET_ERROR ==
        setsockopt(s, IPPROTO_IPV6, IPV6_V6ONLY, (char *)&flg, sizeof(flg))) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s",
                "Dual-stack sockets are not supported on this platform. "
                "Recompile library with disabled IPv6 support.");
        CLOSE(s);
        return PCP_INVALID_SOCKET;
    }
#endif // PCP_USE_IPV6_SOCKET
#if defined(IP_PKTINFO) || defined(IPV6_RECVPKTINFO) || defined(IPV6_PKTINFO)
    {
        int optval = 1;
#if defined WIN32 && defined IPV6_PKTINFO
        if (setsockopt(s, IPPROTO_IPV6, IPV6_PKTINFO, (char *)&optval,
                       sizeof(optval)) < 0) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Unable to set IPV6_PKTINFO option for socket.");
            CLOSE(s);
            return PCP_INVALID_SOCKET;
        }
#endif // WIN32 && IPV6_PKTINFO
#ifdef IP_PKTINFO
        if (setsockopt(s, IPPROTO_IP, IP_PKTINFO, (char *)&optval,
                       sizeof(optval)) < 0) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Unable to set IP_PKTINFO option for socket.");
        }
#endif // IP_PKTINFO
#ifdef IPV6_RECVPKTINFO
        if (setsockopt(s, IPPROTO_IPV6, IPV6_RECVPKTINFO, (char *)&optval,
                       sizeof(optval)) < 0) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Unable to set IPV6_RECVPKTINFO option for socket.");
            CLOSE(s);
            return PCP_INVALID_SOCKET;
        }
#endif // IPV6_RECVPKTINFO
    }
#endif // IP_PKTINFO && IPV6_RECVPKTINFO
    while (bind(s, (struct sockaddr *)&sas, SA_LEN((struct sockaddr *)&sas)) ==
           PCP_SOCKET_ERROR) {
        if (pcp_get_error() == PCP_ERR_ADDRINUSE) {
            if (sas.ss_family == AF_INET) {
                sin->sin_port = htons(ntohs(sin->sin_port) + 1);
            } else {
                sin6->sin6_port = htons(ntohs(sin6->sin6_port) + 1);
            }
        } else {
            PCP_LOG(PCP_LOGLVL_ERR, "%s", "bind error");
            CLOSE(s);
            return PCP_INVALID_SOCKET;
        }
    }
    PCP_LOG(PCP_LOGLVL_DEBUG, "%s: return %d", __FUNCTION__, s);
    return s;
#endif
}